

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O2

MessageType __thiscall cmMessenger::ConvertMessageType(cmMessenger *this,MessageType t)

{
  MessageType MVar1;
  
  if (t < FATAL_ERROR) {
    if ((t == AUTHOR_WARNING & this->DevWarningsAsErrors) == 0) {
      MVar1 = AUTHOR_WARNING;
      if (this->DevWarningsAsErrors != false) {
        MVar1 = t;
      }
      if (t != AUTHOR_ERROR) {
        MVar1 = t;
      }
      return MVar1;
    }
    t = AUTHOR_ERROR;
  }
  else if (t - DEPRECATION_ERROR < 2) {
    if ((t == DEPRECATION_WARNING & this->DeprecatedWarningsAsErrors) == 0) {
      MVar1 = DEPRECATION_WARNING;
      if (this->DeprecatedWarningsAsErrors != false) {
        MVar1 = t;
      }
      if (t != DEPRECATION_ERROR) {
        MVar1 = t;
      }
      return MVar1;
    }
    t = DEPRECATION_ERROR;
  }
  return t;
}

Assistant:

MessageType cmMessenger::ConvertMessageType(MessageType t) const
{
  bool warningsAsErrors;

  if (t == MessageType::AUTHOR_WARNING || t == MessageType::AUTHOR_ERROR) {
    warningsAsErrors = this->GetDevWarningsAsErrors();
    if (warningsAsErrors && t == MessageType::AUTHOR_WARNING) {
      t = MessageType::AUTHOR_ERROR;
    } else if (!warningsAsErrors && t == MessageType::AUTHOR_ERROR) {
      t = MessageType::AUTHOR_WARNING;
    }
  } else if (t == MessageType::DEPRECATION_WARNING ||
             t == MessageType::DEPRECATION_ERROR) {
    warningsAsErrors = this->GetDeprecatedWarningsAsErrors();
    if (warningsAsErrors && t == MessageType::DEPRECATION_WARNING) {
      t = MessageType::DEPRECATION_ERROR;
    } else if (!warningsAsErrors && t == MessageType::DEPRECATION_ERROR) {
      t = MessageType::DEPRECATION_WARNING;
    }
  }

  return t;
}